

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialect_detection.cpp
# Opt level: O1

vector<duckdb::vector<char,_true>,_true> * duckdb::DialectCandidates::GetDefaultQuote(void)

{
  void *pvVar1;
  long lVar2;
  vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_> *in_RDI;
  initializer_list<char> __l;
  initializer_list<char> __l_00;
  initializer_list<char> __l_01;
  initializer_list<duckdb::vector<char,_true>_> __l_02;
  allocator_type local_70;
  allocator_type local_6f;
  char local_6e;
  allocator_type local_6d;
  allocator_type local_6c;
  char local_6b;
  char local_6a [2];
  vector<char,_std::allocator<char>_> local_68;
  vector<char,_std::allocator<char>_> local_50;
  vector<char,_std::allocator<char>_> local_38;
  
  local_6b = '\0';
  __l._M_len = 1;
  __l._M_array = &local_6b;
  ::std::vector<char,_std::allocator<char>_>::vector(&local_68,__l,&local_6c);
  local_6a[0] = '\"';
  local_6a[1] = '\'';
  __l_00._M_len = 2;
  __l_00._M_array = local_6a;
  ::std::vector<char,_std::allocator<char>_>::vector(&local_50,__l_00,&local_6d);
  local_6e = '\"';
  __l_01._M_len = 1;
  __l_01._M_array = &local_6e;
  ::std::vector<char,_std::allocator<char>_>::vector(&local_38,__l_01,&local_6f);
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&local_68;
  ::std::vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_>::vector
            (in_RDI,__l_02,&local_70);
  lVar2 = 0x30;
  do {
    pvVar1 = *(void **)((long)&local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar2);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  return (vector<duckdb::vector<char,_true>,_true> *)in_RDI;
}

Assistant:

vector<vector<char>> DialectCandidates::GetDefaultQuote() {
	return {{'\0'}, {'\"', '\''}, {'\"'}};
}